

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.cpp
# Opt level: O3

SHA3_256 * __thiscall SHA3_256::Write(SHA3_256 *this,Span<const_unsigned_char> data)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ptrdiff_t _Num;
  ulong __n;
  ulong *__src;
  long in_FS_OFFSET;
  
  __n = data.m_size;
  __src = (ulong *)data.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (ulong)this->m_bufsize;
  if ((uVar3 != 0) && (7 < uVar3 + __n)) {
    if (8 - uVar3 != 0) {
      memmove(this->m_buffer + uVar3,__src,8 - uVar3);
      uVar3 = (ulong)this->m_bufsize;
    }
    uVar2 = this->m_pos;
    uVar4 = uVar2 + 1;
    this->m_pos = uVar4;
    this->m_state[uVar2] = this->m_state[uVar2] ^ *(ulong *)this->m_buffer;
    __src = (ulong *)((long)__src + (8 - uVar3));
    __n = __n - (8 - uVar3);
    this->m_bufsize = 0;
    if (uVar4 == 0x11) {
      KeccakF(this->m_state);
      this->m_pos = 0;
    }
  }
  if (7 < __n) {
    uVar2 = this->m_pos;
    do {
      uVar3 = *__src;
      uVar4 = uVar2 + 1;
      this->m_pos = uVar4;
      this->m_state[uVar2] = this->m_state[uVar2] ^ uVar3;
      uVar2 = uVar4;
      if (uVar4 == 0x11) {
        KeccakF(this->m_state);
        this->m_pos = 0;
        uVar2 = 0;
      }
      __src = __src + 1;
      __n = __n - 8;
    } while (7 < __n);
  }
  if (__n != 0) {
    memmove(this->m_buffer + this->m_bufsize,__src,__n);
    this->m_bufsize = this->m_bufsize + (int)__n;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

SHA3_256& SHA3_256::Write(Span<const unsigned char> data)
{
    if (m_bufsize && m_bufsize + data.size() >= sizeof(m_buffer)) {
        // Fill the buffer and process it.
        std::copy(data.begin(), data.begin() + sizeof(m_buffer) - m_bufsize, m_buffer + m_bufsize);
        data = data.subspan(sizeof(m_buffer) - m_bufsize);
        m_state[m_pos++] ^= ReadLE64(m_buffer);
        m_bufsize = 0;
        if (m_pos == RATE_BUFFERS) {
            KeccakF(m_state);
            m_pos = 0;
        }
    }
    while (data.size() >= sizeof(m_buffer)) {
        // Process chunks directly from the buffer.
        m_state[m_pos++] ^= ReadLE64(data.data());
        data = data.subspan(8);
        if (m_pos == RATE_BUFFERS) {
            KeccakF(m_state);
            m_pos = 0;
        }
    }
    if (data.size()) {
        // Keep the remainder in the buffer.
        std::copy(data.begin(), data.end(), m_buffer + m_bufsize);
        m_bufsize += data.size();
    }
    return *this;
}